

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderAtomicCountersTests.cpp
# Opt level: O0

void __thiscall
gl4cts::anon_unknown_0::SACSubcaseBase::LinkProgram(SACSubcaseBase *this,GLuint program)

{
  GLchar local_418 [8];
  GLchar log [1024];
  GLsizei length;
  GLuint program_local;
  SACSubcaseBase *this_local;
  
  log._1020_4_ = program;
  glu::CallLogWrapper::glLinkProgram
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,program);
  glu::CallLogWrapper::glGetProgramInfoLog
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,log._1020_4_,0x400,
             (GLsizei *)(log + 0x3f8),local_418);
  if (1 < (int)log._1016_4_) {
    anon_unknown_0::Output("Program Info Log:\n%s\n",local_418);
  }
  return;
}

Assistant:

void LinkProgram(GLuint program)
	{
		glLinkProgram(program);
		GLsizei length;
		GLchar  log[1024];
		glGetProgramInfoLog(program, sizeof(log), &length, log);
		if (length > 1)
		{
			Output("Program Info Log:\n%s\n", log);
		}
	}